

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::detail::MultipartFormDataParser::parse
          (MultipartFormDataParser *this,char *buf,size_t n,ContentReceiver *content_callback,
          MultipartContentHeader *header_callback)

{
  string *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  byte bVar6;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar7;
  char *__args;
  size_t sStack_d0;
  undefined4 local_bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pattern;
  smatch m;
  string_type local_50;
  
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::re_content_disposition_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::re_content_disposition_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::re_content_disposition_abi_cxx11_,
               "^Content-Disposition:\\s*form-data;\\s*name=\"(.*?)\"(?:;\\s*filename=\"(.*?)\")?(?:;\\s*filename\\*=\\S+)?\\s*$"
               ,1);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::re_content_disposition_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::re_content_disposition_abi_cxx11_);
  }
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::dash__abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::dash__abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::dash__abi_cxx11_,"--",(allocator<char> *)&pattern);
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::dash__abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::dash__abi_cxx11_);
  }
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::crlf__abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::crlf__abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::crlf__abi_cxx11_,"\r\n",(allocator<char> *)&pattern);
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::crlf__abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::crlf__abi_cxx11_);
  }
  buf_append(this,buf,n);
  this_00 = &(this->file_).content_type;
  local_bc = SUB84(this_00,0);
switchD_0013ba5a_default:
  bVar6 = 1;
  if (this->buf_epos_ == this->buf_spos_) goto LAB_0013bf78;
  switch(this->state_) {
  case 0:
    std::operator+((string *)&m,
                   &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                    ::dash__abi_cxx11_,&this->boundary_);
    std::operator+(&pattern,(string *)&m,
                   &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                    ::crlf__abi_cxx11_);
    std::__cxx11::string::~string((string *)&m);
    bVar1 = true;
    if (this->buf_epos_ - this->buf_spos_ < pattern._M_string_length) {
      local_bc = 1;
    }
    else {
      bVar2 = buf_start_with(this,&pattern);
      if (bVar2) {
        this->buf_spos_ = this->buf_spos_ + pattern._M_string_length;
        this->state_ = 1;
        bVar1 = false;
      }
      else {
        local_bc = 0;
      }
    }
    bVar6 = (byte)local_bc;
    std::__cxx11::string::~string((string *)&pattern);
    bVar1 = !bVar1;
    break;
  case 1:
    clear_file_info(this);
    sStack_d0 = 2;
    goto LAB_0013bcea;
  case 2:
    sVar4 = buf_find(this,&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                           ::crlf__abi_cxx11_);
    if (0x2000 < sVar4) goto LAB_0013bf76;
    while (sVar4 < this->buf_epos_ - this->buf_spos_) {
      if (sVar4 == 0) {
        bVar1 = std::function<bool_(const_httplib::MultipartFormData_&)>::operator()
                          (header_callback,&this->file_);
        if (!bVar1) goto switchD_0013ba5a_caseD_5;
        this->buf_spos_ =
             this->buf_spos_ +
             parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
             ::crlf__abi_cxx11_._M_string_length;
        sStack_d0 = 3;
        goto LAB_0013bcea;
      }
      if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
           ::header_name_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                       ::header_name_abi_cxx11_), iVar3 != 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                    ::header_name_abi_cxx11_,"content-type:",(allocator<char> *)&pattern);
        __cxa_atexit(std::__cxx11::string::~string,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::header_name_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                             ::header_name_abi_cxx11_);
      }
      buf_head_abi_cxx11_(&pattern,this,sVar4);
      bVar1 = start_with_case_ignore
                        (this,&pattern,
                         &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                          ::header_name_abi_cxx11_);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&pattern);
        trim_copy((string *)&m,&local_50);
        std::__cxx11::string::operator=((string *)this_00,(string *)&m);
        std::__cxx11::string::~string((string *)&m);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        m.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        m._M_begin._M_current = (char *)0x0;
        m.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        m.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar1 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          (&pattern,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&m,
                           &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                            ::re_content_disposition_abi_cxx11_,0);
        if (bVar1) {
          lVar5 = (long)m.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)m.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar5 == 0) || (0xfffffffffffffffd < lVar5 / 0x18 - 5U)) {
            psVar7 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)m.
                               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x48);
          }
          else {
            psVar7 = m.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(&local_50,psVar7);
          std::__cxx11::string::operator=((string *)&this->file_,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          lVar5 = (long)m.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)m.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar5 == 0) || (0xfffffffffffffffc < lVar5 / 0x18 - 6U)) {
            psVar7 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)m.
                               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x48);
          }
          else {
            psVar7 = m.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2;
          }
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(&local_50,psVar7);
          std::__cxx11::string::operator=((string *)&(this->file_).filename,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        std::
        _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&m);
      }
      this->buf_spos_ =
           this->buf_spos_ +
           sVar4 + parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                   ::crlf__abi_cxx11_._M_string_length;
      sVar4 = buf_find(this,&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                             ::crlf__abi_cxx11_);
      std::__cxx11::string::~string((string *)&pattern);
    }
    bVar1 = this->state_ == 3;
    bVar6 = 1;
    break;
  case 3:
    std::operator+(&pattern,&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                             ::crlf__abi_cxx11_,
                   &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                    ::dash__abi_cxx11_);
    if (this->buf_epos_ - this->buf_spos_ < pattern._M_string_length) {
      local_bc = 1;
      bVar1 = false;
    }
    else {
      sVar4 = buf_find(this,&pattern);
      bVar1 = std::function<bool_(const_char_*,_unsigned_long)>::operator()
                        (content_callback,(this->buf_)._M_dataplus._M_p + this->buf_spos_,sVar4);
      if (bVar1) {
        this->buf_spos_ = this->buf_spos_ + sVar4;
        bVar1 = true;
      }
      else {
        this->is_valid_ = false;
        bVar1 = false;
        local_bc = 0;
      }
    }
    bVar6 = (byte)local_bc;
    std::__cxx11::string::~string((string *)&pattern);
    if (!bVar1) goto LAB_0013bf78;
    std::operator+((string *)&m,
                   &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                    ::crlf__abi_cxx11_,
                   &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                    ::dash__abi_cxx11_);
    std::operator+(&pattern,(string *)&m,&this->boundary_);
    std::__cxx11::string::~string((string *)&m);
    if (this->buf_epos_ - this->buf_spos_ < pattern._M_string_length) {
      local_bc = 1;
      bVar1 = false;
    }
    else {
      sVar4 = buf_find(this,&pattern);
      __args = (this->buf_)._M_dataplus._M_p + this->buf_spos_;
      if (sVar4 < this->buf_epos_ - this->buf_spos_) {
        bVar1 = std::function<bool_(const_char_*,_unsigned_long)>::operator()
                          (content_callback,__args,sVar4);
        if (!bVar1) {
LAB_0013bf4b:
          this->is_valid_ = false;
          bVar1 = false;
          local_bc = 0;
          goto LAB_0013bf54;
        }
        this->buf_spos_ = this->buf_spos_ + sVar4 + pattern._M_string_length;
        this->state_ = 4;
      }
      else {
        bVar1 = std::function<bool_(const_char_*,_unsigned_long)>::operator()
                          (content_callback,__args,pattern._M_string_length);
        if (!bVar1) goto LAB_0013bf4b;
        this->buf_spos_ = this->buf_spos_ + pattern._M_string_length;
      }
      bVar1 = true;
    }
LAB_0013bf54:
    std::__cxx11::string::~string((string *)&pattern);
LAB_0013bf60:
    bVar6 = (byte)local_bc;
    break;
  case 4:
    if (this->buf_epos_ - this->buf_spos_ <
        parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
        ::crlf__abi_cxx11_._M_string_length) goto LAB_0013bf78;
    bVar1 = buf_start_with(this,&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                 ::crlf__abi_cxx11_);
    if (!bVar1) {
      std::operator+(&pattern,&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                               ::dash__abi_cxx11_,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::crlf__abi_cxx11_);
      if ((this->buf_epos_ - this->buf_spos_ < pattern._M_string_length) ||
         (bVar1 = buf_start_with(this,&pattern), !bVar1)) {
        bVar1 = false;
        local_bc = 1;
      }
      else {
        this->buf_spos_ = this->buf_spos_ + pattern._M_string_length;
        this->is_valid_ = true;
        this->state_ = 5;
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)&pattern);
      goto LAB_0013bf60;
    }
    this->buf_spos_ =
         this->buf_spos_ +
         parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
         ::crlf__abi_cxx11_._M_string_length;
    sStack_d0 = 1;
LAB_0013bcea:
    this->state_ = sStack_d0;
    goto switchD_0013ba5a_default;
  case 5:
    goto switchD_0013ba5a_caseD_5;
  default:
    goto switchD_0013ba5a_default;
  }
  if (!bVar1) goto LAB_0013bf78;
  goto switchD_0013ba5a_default;
switchD_0013ba5a_caseD_5:
  this->is_valid_ = false;
LAB_0013bf76:
  bVar6 = 0;
LAB_0013bf78:
  return (bool)(bVar6 & 1);
}

Assistant:

bool parse(const char *buf, size_t n, const ContentReceiver &content_callback,
             const MultipartContentHeader &header_callback) {

    // TODO: support 'filename*'
    static const std::regex re_content_disposition(
        R"~(^Content-Disposition:\s*form-data;\s*name="(.*?)"(?:;\s*filename="(.*?)")?(?:;\s*filename\*=\S+)?\s*$)~",
        std::regex_constants::icase);

    static const std::string dash_ = "--";
    static const std::string crlf_ = "\r\n";

    buf_append(buf, n);

    while (buf_size() > 0) {
      switch (state_) {
      case 0: { // Initial boundary
        auto pattern = dash_ + boundary_ + crlf_;
        if (pattern.size() > buf_size()) { return true; }
        if (!buf_start_with(pattern)) { return false; }
        buf_erase(pattern.size());
        state_ = 1;
        break;
      }
      case 1: { // New entry
        clear_file_info();
        state_ = 2;
        break;
      }
      case 2: { // Headers
        auto pos = buf_find(crlf_);
        if (pos > CPPHTTPLIB_HEADER_MAX_LENGTH) { return false; }
        while (pos < buf_size()) {
          // Empty line
          if (pos == 0) {
            if (!header_callback(file_)) {
              is_valid_ = false;
              return false;
            }
            buf_erase(crlf_.size());
            state_ = 3;
            break;
          }

          static const std::string header_name = "content-type:";
          const auto header = buf_head(pos);
          if (start_with_case_ignore(header, header_name)) {
            file_.content_type = trim_copy(header.substr(header_name.size()));
          } else {
            std::smatch m;
            if (std::regex_match(header, m, re_content_disposition)) {
              file_.name = m[1];
              file_.filename = m[2];
            }
          }

          buf_erase(pos + crlf_.size());
          pos = buf_find(crlf_);
        }
        if (state_ != 3) { return true; }
        break;
      }
      case 3: { // Body
        {
          auto pattern = crlf_ + dash_;
          if (pattern.size() > buf_size()) { return true; }

          auto pos = buf_find(pattern);

          if (!content_callback(buf_data(), pos)) {
            is_valid_ = false;
            return false;
          }

          buf_erase(pos);
        }
        {
          auto pattern = crlf_ + dash_ + boundary_;
          if (pattern.size() > buf_size()) { return true; }

          auto pos = buf_find(pattern);
          if (pos < buf_size()) {
            if (!content_callback(buf_data(), pos)) {
              is_valid_ = false;
              return false;
            }

            buf_erase(pos + pattern.size());
            state_ = 4;
          } else {
            if (!content_callback(buf_data(), pattern.size())) {
              is_valid_ = false;
              return false;
            }

            buf_erase(pattern.size());
          }
        }
        break;
      }
      case 4: { // Boundary
        if (crlf_.size() > buf_size()) { return true; }
        if (buf_start_with(crlf_)) {
          buf_erase(crlf_.size());
          state_ = 1;
        } else {
          auto pattern = dash_ + crlf_;
          if (pattern.size() > buf_size()) { return true; }
          if (buf_start_with(pattern)) {
            buf_erase(pattern.size());
            is_valid_ = true;
            state_ = 5;
          } else {
            return true;
          }
        }
        break;
      }
      case 5: { // Done
        is_valid_ = false;
        return false;
      }
      }
    }

    return true;
  }